

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassicSudokuVisualizer.cpp
# Opt level: O1

string * __thiscall
ClassicSudokuVisualizer::createBorderTopStyle_abi_cxx11_
          (string *__return_storage_ptr__,ClassicSudokuVisualizer *this)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  string __str;
  char *local_68;
  uint local_60;
  char local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  ulong local_40;
  ClassicSudokuVisualizer *local_38;
  
  uVar6 = (this->gitter).elements;
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (uVar6 != 0) {
    uVar4 = 0;
    local_40 = (ulong)uVar6;
    do {
      uVar6 = uVar4 * (int)local_40;
      uVar7 = (int)local_40 + uVar6;
      if (uVar6 < uVar7) {
        do {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          cVar2 = '\x01';
          if (9 < uVar6) {
            uVar5 = (ulong)uVar6;
            cVar1 = '\x04';
            do {
              cVar2 = cVar1;
              uVar3 = (uint)uVar5;
              if (uVar3 < 100) {
                cVar2 = cVar2 + -2;
                goto LAB_00112575;
              }
              if (uVar3 < 1000) {
                cVar2 = cVar2 + -1;
                goto LAB_00112575;
              }
              if (uVar3 < 10000) goto LAB_00112575;
              uVar5 = uVar5 / 10000;
              cVar1 = cVar2 + '\x04';
            } while (99999 < uVar3);
            cVar2 = cVar2 + '\x01';
          }
LAB_00112575:
          local_68 = local_58;
          std::__cxx11::string::_M_construct((ulong)&local_68,cVar2);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_68,local_60,uVar6);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68);
          if (local_68 != local_58) {
            operator_delete(local_68);
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar7);
      }
      uVar4 = uVar4 + (local_38->gitter).quadHeight;
    } while (uVar4 < (uint)local_40);
  }
  std::__cxx11::string::substr((ulong)&local_68,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string ClassicSudokuVisualizer::createBorderTopStyle() {
    unsigned int size = gitter.getElements();
    unsigned int h = 0;
    std::string border_top = "";
    while (h < size) {
        unsigned int iStart = h * size;
        for (unsigned int i = iStart; i < iStart + size; i++) {
            border_top.append("#cell-");
            border_top.append(std::to_string(i));
            border_top.append(", ");
        }
        h += gitter.getQuadHeight();
    }
    border_top = border_top.substr(0, border_top.length() - 2);
    border_top.append(" { border-top: 2px solid #000; } ");
    return border_top;
}